

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::log_assert(JUnitReporter *this,AssertData *rb)

{
  pointer *ppJVar1;
  int *piVar2;
  pointer pJVar3;
  pointer __first;
  JUnitReporter *pJVar4;
  char *pcVar5;
  ostream *poVar6;
  IContextScope **ppIVar7;
  AssertData *pAVar8;
  pointer __result;
  pointer pJVar9;
  pointer pJVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  char *__s;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  String *__s_00;
  undefined1 *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long *in_FS_OFFSET;
  allocator<char> local_22a;
  allocator<char> local_229;
  AssertData *local_228;
  pthread_mutex_t *local_220;
  pointer local_218;
  JUnitReporter *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [32];
  ostringstream os;
  undefined1 local_1a0 [368];
  
  if (rb->m_failed == true) {
    local_220 = (pthread_mutex_t *)&this->mutex;
    std::mutex::lock((mutex *)&local_220->__data);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    pcVar5 = skipPathFromFilename(rb->m_file);
    poVar6 = std::operator<<((ostream *)&os,pcVar5);
    pcVar5 = "(";
    if (this->opt->gnu_file_line != false) {
      pcVar5 = ":";
    }
    poVar6 = std::operator<<(poVar6,pcVar5);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    pcVar5 = "):";
    if (this->opt->gnu_file_line != false) {
      pcVar5 = ":";
    }
    poVar6 = std::operator<<(poVar6,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar6);
    fulltext_log_assert_to_stream((ostream *)&os,rb);
    detail::g_infoContexts::__tls_init();
    uVar13 = (ulong)(*(long *)(*in_FS_OFFSET + -0x28) - *(long *)(*in_FS_OFFSET + -0x30)) >> 3;
    iVar12 = (int)uVar13;
    local_228 = rb;
    local_210 = this;
    if (iVar12 != 0) {
      ppIVar7 = IReporter::get_active_contexts();
      std::operator<<((ostream *)&os,"  logged: ");
      uVar14 = 0;
      uVar13 = uVar13 & 0xffffffff;
      if (iVar12 < 1) {
        uVar13 = uVar14;
      }
      for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        pcVar5 = "          ";
        if (uVar14 == 0) {
          pcVar5 = "";
        }
        std::operator<<((ostream *)&os,pcVar5);
        (*ppIVar7[uVar14]->_vptr_IContextScope[2])(ppIVar7[uVar14],&os);
        std::endl<char,std::char_traits<char>>((ostream *)&os);
      }
    }
    pAVar8 = local_228;
    if ((local_228->m_decomp).field_0.buf[0x17] < '\0') {
      __s_00 = (String *)(local_228->m_decomp).field_0.data.ptr;
    }
    else {
      __s_00 = &local_228->m_decomp;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,(char *)__s_00,&local_229);
    pJVar4 = local_210;
    pcVar5 = assertString(pAVar8->m_at);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar5,&local_22a);
    __n = local_1a0;
    std::__cxx11::stringbuf::str();
    pJVar3 = (pJVar4->testCaseData).testcases.
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pJVar10 = pJVar3[-1].failures.
              super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pJVar10 ==
        pJVar3[-1].failures.
        super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pAVar8 = (AssertData *)
               std::
               vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ::_M_check_len(&pJVar3[-1].failures,(size_type)__n,__s);
      __first = pJVar3[-1].failures.
                super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_218 = pJVar3[-1].failures.
                  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      __result = std::
                 _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ::_M_allocate((_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                                *)pAVar8,(size_t)__n);
      __args_1 = &local_208;
      local_228 = pAVar8;
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)(((long)pJVar10 - (long)__first) + (long)__result),
                 (JUnitTestMessage *)local_1c8,&local_1e8,__args_1,in_R8);
      pJVar9 = std::
               vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ::_S_relocate(__first,pJVar10,__result,(_Tp_alloc_type *)__args_1);
      pJVar10 = std::
                vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ::_S_relocate(pJVar10,local_218,pJVar9 + 1,(_Tp_alloc_type *)__args_1);
      lVar11 = (long)pJVar3[-1].failures.
                     super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
      std::
      _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ::_M_deallocate((_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                       *)__first,(pointer)(lVar11 / 0x60),lVar11 % 0x60);
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_finish = pJVar10;
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)local_228;
    }
    else {
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)pJVar10,(JUnitTestMessage *)local_1c8,&local_1e8,&local_208,in_R8
                );
      ppJVar1 = &pJVar3[-1].failures.
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppJVar1 = *ppJVar1 + 1;
    }
    piVar2 = &(pJVar4->testCaseData).totalFailures;
    *piVar2 = *piVar2 + 1;
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    pthread_mutex_unlock(local_220);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed) // report only failures & ignore the `success` option
                return;

            std::lock_guard<std::mutex> lock(mutex);

            std::ostringstream os;
            os << skipPathFromFilename(rb.m_file) << (opt.gnu_file_line ? ":" : "(")
              << line(rb.m_line) << (opt.gnu_file_line ? ":" : "):") << std::endl;

            fulltext_log_assert_to_stream(os, rb);
            log_contexts(os);
            testCaseData.addFailure(rb.m_decomp.c_str(), assertString(rb.m_at), os.str());
        }